

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetItem
               (RecyclableObject *instance,uint64 index,Var *value,ScriptContext *requestContext)

{
  uint64 instance_00;
  PropertyId propertyId;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecord;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint64 index_local;
  RecyclableObject *instance_local;
  
  propertyRecord = (PropertyRecord *)requestContext;
  requestContext_local = (ScriptContext *)value;
  value_local = (Var *)index;
  index_local = (uint64)instance;
  if (index < 0xffffffff) {
    instance_local._4_4_ = GetItem(instance,(uint32)index,value,requestContext);
  }
  else {
    local_38 = (PropertyRecord *)0x0;
    GetPropertyIdForInt(index,requestContext,&local_38);
    instance_00 = index_local;
    propertyId = PropertyRecord::GetPropertyId(local_38);
    instance_local._4_4_ =
         GetProperty((RecyclableObject *)instance_00,propertyId,(Var *)requestContext_local,
                     (ScriptContext *)propertyRecord,(PropertyValueInfo *)0x0);
  }
  return instance_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetItem(RecyclableObject* instance, uint64 index, Var* value, ScriptContext* requestContext)
    {
        if (index < JavascriptArray::InvalidIndex)
        {
            // In case index fits in uint32, we can avoid the (slower) big-index path
            return GetItem(instance, static_cast<uint32>(index), value, requestContext);
        }
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, requestContext, &propertyRecord);
        return JavascriptOperators::GetProperty(instance, propertyRecord->GetPropertyId(), value, requestContext);
    }